

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_atlas_init_default(nk_font_atlas *atlas)

{
  nk_size in_RDI;
  
  if (in_RDI != 0) {
    nk_zero(atlas,in_RDI);
    *(undefined8 *)(in_RDI + 0x28) = 0;
    *(code **)(in_RDI + 0x30) = nk_malloc;
    *(code **)(in_RDI + 0x38) = nk_mfree;
    *(undefined8 *)(in_RDI + 0x10) = 0;
    *(code **)(in_RDI + 0x18) = nk_malloc;
    *(code **)(in_RDI + 0x20) = nk_mfree;
  }
  return;
}

Assistant:

NK_API void
nk_font_atlas_init_default(struct nk_font_atlas *atlas)
{
NK_ASSERT(atlas);
if (!atlas) return;
nk_zero_struct(*atlas);
atlas->temporary.userdata.ptr = 0;
atlas->temporary.alloc = nk_malloc;
atlas->temporary.free = nk_mfree;
atlas->permanent.userdata.ptr = 0;
atlas->permanent.alloc = nk_malloc;
atlas->permanent.free = nk_mfree;
}